

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

_Bool Is_There_Room_For_A_Line(FORM *form)

{
  int iVar1;
  int iVar2;
  FIELD *pFVar3;
  char *pcVar4;
  char *pcVar5;
  char *s;
  char *begin_of_last_line;
  FIELD *field;
  FORM *form_local;
  
  pFVar3 = form->current;
  Synchronize_Buffer(form);
  pcVar4 = pFVar3->buf;
  iVar1 = pFVar3->drows;
  iVar2 = pFVar3->dcols;
  pcVar5 = After_End_Of_Data(pcVar4 + (iVar1 + -1) * iVar2,pFVar3->dcols);
  return pcVar5 == pcVar4 + (iVar1 + -1) * iVar2;
}

Assistant:

INLINE static bool Is_There_Room_For_A_Line(FORM * form)
{
  FIELD *field = form->current;
  char *begin_of_last_line, *s;
  
  Synchronize_Buffer(form);
  begin_of_last_line = Address_Of_Row_In_Buffer(field,(field->drows-1));
  s  = After_End_Of_Data(begin_of_last_line,field->dcols);
  return ((s==begin_of_last_line) ? TRUE : FALSE);
}